

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O1

long julian(long date)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  lVar4 = date + -0x16761;
  lVar2 = 0x16761;
  lVar3 = -0x5c;
  uVar5 = 0x5c;
  lVar6 = -0x168ce;
  while( true ) {
    if ((uVar5 & 3) == 0) {
      uVar1 = (ulong)((uVar5 / 100) * 100 + lVar3 != 0);
    }
    else {
      uVar1 = 0;
    }
    lVar4 = lVar4 + lVar2;
    if (lVar4 <= (long)(uVar1 + lVar2 + 0x16c)) break;
    lVar4 = lVar4 + (lVar6 - uVar1);
    lVar2 = lVar2 + 1000;
    lVar3 = lVar3 + -1;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + -1000;
  }
  return lVar4;
}

Assistant:

long
julian(long date)
{
    long       offset;
    long      result;
    long      yr;
    long      yend;

    offset = date - STARTDATE;
    result = STARTDATE;

#ifdef _MSC_VER
/* Disable warning about conditional expression is constant */ 
#pragma warning(disable:4127)
#endif 

    while (1)
        {
#ifdef _MSC_VER
#pragma warning(default:4127)
#endif 
        yr = result / 1000;
        yend = yr * 1000 + 365 + LEAP(yr);
        if (result + offset > yend)   /* overflow into next year */
            {
            offset -= yend - result + 1;
            result += 1000;
            continue;
            }
        else
            break;
        }
    return (result + offset);
}